

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool bssl::tls13_derive_application_secrets(SSL_HANDSHAKE *hs)

{
  SSL3_STATE *pSVar1;
  SSL *pSVar2;
  SSL *pSVar3;
  bool bVar4;
  size_t in_R8;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> secret_00;
  Span<const_unsigned_char> secret_01;
  char *local_80;
  uchar *local_78;
  string_view local_70;
  char *local_60;
  uchar *local_58;
  string_view local_50;
  char *local_40;
  uchar *local_38;
  string_view local_30;
  SSL *local_20;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  local_20 = hs->ssl;
  ssl = (SSL *)hs;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"c ap traffic")
  ;
  bVar4 = derive_secret(hs,&hs->client_traffic_secret_0,local_30);
  pSVar3 = local_20;
  if (bVar4) {
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)&local_40,
               (InplaceVector<unsigned_char,_64UL> *)((long)&ssl[1].ex_data.sk + 4));
    secret.size_ = in_R8;
    secret.data_ = local_38;
    bVar4 = ssl_log_secret((bssl *)pSVar3,(SSL *)"CLIENT_TRAFFIC_SECRET_0",local_40,secret);
    pSVar3 = ssl;
    if (bVar4) {
      pSVar2 = ssl + 2;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,"s ap traffic");
      bVar4 = derive_secret((SSL_HANDSHAKE *)pSVar3,
                            (InplaceVector<unsigned_char,_64UL> *)&pSVar2->field_0x15,local_50);
      pSVar3 = local_20;
      if (bVar4) {
        Span<unsigned_char_const>::
        Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                  ((Span<unsigned_char_const> *)&local_60,
                   (InplaceVector<unsigned_char,_64UL> *)&ssl[2].field_0x15);
        secret_00.size_ = in_R8;
        secret_00.data_ = local_58;
        bVar4 = ssl_log_secret((bssl *)pSVar3,(SSL *)"SERVER_TRAFFIC_SECRET_0",local_60,secret_00);
        pSVar3 = ssl;
        if (bVar4) {
          pSVar1 = local_20->s3;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_70,"exp master");
          bVar4 = derive_secret((SSL_HANDSHAKE *)pSVar3,&pSVar1->exporter_secret,local_70);
          pSVar3 = local_20;
          if (bVar4) {
            Span<unsigned_char_const>::
            Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                      ((Span<unsigned_char_const> *)&local_80,&local_20->s3->exporter_secret);
            secret_01.size_ = in_R8;
            secret_01.data_ = local_78;
            bVar4 = ssl_log_secret((bssl *)pSVar3,(SSL *)"EXPORTER_SECRET",local_80,secret_01);
            if (bVar4) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool tls13_derive_application_secrets(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (!derive_secret(hs, &hs->client_traffic_secret_0,
                     kTLS13LabelClientApplicationTraffic) ||
      !ssl_log_secret(ssl, "CLIENT_TRAFFIC_SECRET_0",
                      hs->client_traffic_secret_0) ||
      !derive_secret(hs, &hs->server_traffic_secret_0,
                     kTLS13LabelServerApplicationTraffic) ||
      !ssl_log_secret(ssl, "SERVER_TRAFFIC_SECRET_0",
                      hs->server_traffic_secret_0) ||
      !derive_secret(hs, &ssl->s3->exporter_secret, kTLS13LabelExporter) ||
      !ssl_log_secret(ssl, "EXPORTER_SECRET", ssl->s3->exporter_secret)) {
    return false;
  }

  return true;
}